

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palobjbase.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CPalObjectBase::GetImmutableData(CPalObjectBase *this,void **ppvImmutableData)

{
  DWORD DVar1;
  void **ppvImmutableData_local;
  CPalObjectBase *this_local;
  
  if (ppvImmutableData == (void **)0x0) {
    fprintf(_stderr,"] %s %s:%d","GetImmutableData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/palobjbase.cpp"
            ,0xa2);
    fprintf(_stderr,"Expression: NULL != ppvImmutableData\n");
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  DVar1 = CObjectType::GetImmutableDataSize(this->m_pot);
  if (DVar1 == 0) {
    fprintf(_stderr,"] %s %s:%d","GetImmutableData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/palobjbase.cpp"
            ,0xaa);
    fprintf(_stderr,"Expression: 0 < m_pot->GetImmutableDataSize()\n");
  }
  *ppvImmutableData = this->m_pvImmutableData;
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return 0;
}

Assistant:

PAL_ERROR
CPalObjectBase::GetImmutableData(
    void **ppvImmutableData             // OUT
    )
{
    _ASSERTE(NULL != ppvImmutableData);
    
    ENTRY("CPalObjectBase::GetImmutableData"
        "(this = %p, ppvImmutableData = %p)\n",
        this,
        ppvImmutableData
        );
    
    _ASSERTE(0 < m_pot->GetImmutableDataSize());

    *ppvImmutableData = m_pvImmutableData;

    LOGEXIT("CPalObjectBase::GetImmutableData returns %d\n", NO_ERROR);

    return NO_ERROR;
}